

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTests.cpp
# Opt level: O2

void __thiscall
agge::tests::PathGeneratorAdapterTests::SubpathIsFullyPassedToGenerator
          (PathGeneratorAdapterTests *this)

{
  passthrough_generator *generator;
  undefined1 *puVar1;
  point *ppVar2;
  allocator local_195;
  uint local_194;
  LocationInfo local_190;
  path local_168;
  undefined8 local_148;
  string local_138;
  point reference2 [5];
  point reference1 [2];
  path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
  pg;
  path p;
  point input [7];
  
  puVar1 = &DAT_001a6c90;
  ppVar2 = input;
  for (generator = (passthrough_generator *)0x54; generator != (passthrough_generator *)0x0;
      generator = (passthrough_generator *)((long)&generator[-1].ky + 3)) {
    *(undefined1 *)&((point *)&ppVar2->x)->x = *puVar1;
    puVar1 = puVar1 + 1;
    ppVar2 = (point *)((long)&((point *)&ppVar2->x)->x + 1);
  }
  mocks::path::path<agge::tests::mocks::path::point,7ul>(&p,&input);
  local_168.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.position = 0;
  local_168.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148 = 0x3f8000003f800000;
  assist<agge::tests::mocks::path,agge::tests::(anonymous_namespace)::passthrough_generator>
            (&pg,(agge *)&p,&local_168,generator);
  std::vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  resize(&local_168.points,3,(value_type)ZEXT812(0));
  vertex<agge::path_generator_adapter<agge::tests::mocks::path,agge::tests::(anonymous_namespace)::passthrough_generator>>
            (&pg);
  reference1[0].x = 2.0;
  reference1[0].y = 7.0;
  reference1[0].command = 1;
  reference1[1].x = 37.1;
  reference1[1].y = 19.7;
  reference1[1].command = 2;
  std::__cxx11::string::string
            ((string *)&local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PathTests.cpp"
             ,(allocator *)&local_138);
  ut::LocationInfo::LocationInfo((LocationInfo *)reference2,&local_190.filename,0xe2);
  ut::
  are_equal<agge::tests::mocks::path::point,2ul,std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>>
            (&reference1,&local_168.points,(LocationInfo *)reference2);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  resize(&local_168.points,0x11,(value_type)ZEXT812(0));
  vertex<agge::path_generator_adapter<agge::tests::mocks::path,agge::tests::(anonymous_namespace)::passthrough_generator>>
            (&pg);
  local_194 = 0x11;
  local_138._M_dataplus._M_p =
       (pointer)(((long)local_168.points.
                        super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_168.points.
                       super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0xc);
  std::__cxx11::string::string
            ((string *)&local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PathTests.cpp"
             ,&local_195);
  ut::LocationInfo::LocationInfo((LocationInfo *)reference2,&local_190.filename,0xeb);
  ut::are_equal<unsigned_int,unsigned_long>
            (&local_194,(unsigned_long *)&local_138,(LocationInfo *)reference2);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  vertex<agge::path_generator_adapter<agge::tests::mocks::path,agge::tests::(anonymous_namespace)::passthrough_generator>>
            (&pg);
  reference2[4].x = 1.0;
  reference2[4].y = 17.0;
  reference2[4].command = 2;
  reference2[2].command = 2;
  reference2[3].x = 11.0;
  reference2[3].y = 23.0;
  reference2[3].command = 2;
  reference2[1].y = 7.3;
  reference2[1].command = 2;
  reference2[2].x = 171.1;
  reference2[2].y = 19.7;
  reference2[0].x = 11.0;
  reference2[0].y = 23.0;
  reference2[0].command = 1;
  reference2[1].x = 2.3;
  std::__cxx11::string::string
            ((string *)&local_138,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PathTests.cpp"
             ,(allocator *)&local_194);
  ut::LocationInfo::LocationInfo(&local_190,&local_138,0xf9);
  ut::
  are_equal<agge::tests::mocks::path::point,5ul,std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>>
            (&reference2,&local_168.points,&local_190);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::
  _Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  ~_Vector_base((_Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                 *)&pg);
  std::
  _Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  ~_Vector_base((_Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                 *)&local_168);
  std::
  _Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  ~_Vector_base((_Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                 *)&p);
  return;
}

Assistant:

test( SubpathIsFullyPassedToGenerator )
			{
				// INIT
				mocks::path::point input[] = {
					{ 2.0f, 7.0f, path_command_move_to },
					{ 37.1f, 19.7f, path_command_line_to },
					{ 11.0f, 23.0f, path_command_move_to },
					{ 2.3f, 7.3f, path_command_line_to },
					{ 171.1f, 19.7f, path_command_line_to },
					{ 11.0f, 23.0f, path_command_line_to },
					{ 1.0f, 17.0f, path_command_line_to },
				};
				mocks::path p(input);
				passthrough_generator g;
				path_generator_adapter<mocks::path, passthrough_generator> pg = assist(p, g);

				g.points.resize(3); // Resize to check if its cleared.

				// ACT
				vertex(pg);

				// ASSERT
				mocks::path::point reference1[] = {
					{ 2.0f, 7.0f, path_command_move_to },
					{ 37.1f, 19.7f, path_command_line_to },
				};

				assert_equal(reference1, g.points);

				// INIT
				g.points.resize(17);

				// ACT
				vertex(pg);

				// ASSERT
				assert_equal(17u, g.points.size()); // no change

				// ACT (new subpath)
				vertex(pg);

				// ASSERT
				mocks::path::point reference2[] = {
					{ 11.0f, 23.0f, path_command_move_to },
					{ 2.3f, 7.3f, path_command_line_to },
					{ 171.1f, 19.7f, path_command_line_to },
					{ 11.0f, 23.0f, path_command_line_to },
					{ 1.0f, 17.0f, path_command_line_to },
				};

				assert_equal(reference2, g.points);
			}